

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall Rml::BaseXMLParser::FindWord(BaseXMLParser *this,String *word,char *terminators)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  byte unaff_R12B;
  
  do {
    if ((this->xml_source)._M_string_length <= this->xml_index) {
      bVar2 = 0;
      break;
    }
    bVar2 = Look(this);
    if (bVar2 < 0xd) {
      if (bVar2 != 9) {
        if (bVar2 != 10) goto LAB_001e3a96;
        this->line_number = this->line_number + 1;
      }
LAB_001e3a89:
      bVar1 = true;
      bVar2 = 1;
      if (word->_M_string_length == 0) {
LAB_001e3ac3:
        this->xml_index = this->xml_index + 1;
        bVar1 = false;
        bVar2 = unaff_R12B;
      }
    }
    else {
      if ((bVar2 == 0xd) || (bVar2 == 0x20)) goto LAB_001e3a89;
LAB_001e3a96:
      if ((terminators == (char *)0x0) ||
         (pcVar3 = strchr(terminators,(int)(char)bVar2), pcVar3 == (char *)0x0)) {
        ::std::__cxx11::string::push_back((char)word);
        goto LAB_001e3ac3;
      }
      bVar2 = word->_M_string_length != 0;
      bVar1 = true;
    }
    unaff_R12B = bVar2;
  } while (!bVar1);
  return (bool)(bVar2 & 1);
}

Assistant:

bool BaseXMLParser::FindWord(String& word, const char* terminators)
{
	while (!AtEnd())
	{
		char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Ignore white space
		if (StringUtilities::IsWhitespace(c))
		{
			if (word.empty())
			{
				Next();
				continue;
			}
			else
				return true;
		}

		// Check for termination condition
		if (terminators && strchr(terminators, c))
		{
			return !word.empty();
		}

		word += c;
		Next();
	}

	return false;
}